

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O3

int libtorrent::ed25519_verify
              (uchar *signature,uchar *message,ptrdiff_t message_len,uchar *public_key)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  span<const_char> data;
  span<const_char> data_00;
  span<const_char> data_01;
  uchar checker [32];
  sha512_hash h;
  hasher512 hash;
  ge_p2 R;
  ge_p3 A;
  uchar local_288;
  uchar uStack_287;
  uchar uStack_286;
  uchar uStack_285;
  uchar uStack_284;
  uchar uStack_283;
  uchar uStack_282;
  uchar uStack_281;
  uchar uStack_280;
  uchar uStack_27f;
  uchar uStack_27e;
  uchar uStack_27d;
  uchar uStack_27c;
  uchar uStack_27b;
  uchar uStack_27a;
  uchar uStack_279;
  uchar local_278;
  uchar uStack_277;
  uchar uStack_276;
  uchar uStack_275;
  uchar uStack_274;
  uchar uStack_273;
  uchar uStack_272;
  uchar uStack_271;
  uchar uStack_270;
  uchar uStack_26f;
  uchar uStack_26e;
  uchar uStack_26d;
  uchar uStack_26c;
  uchar uStack_26b;
  uchar uStack_26a;
  uchar uStack_269;
  sha512_hash local_260;
  hasher512 local_220;
  ge_p2 local_148;
  ge_p3 local_d0;
  
  uVar2 = 0;
  if (signature[0x3f] < 0x20) {
    iVar1 = ge_frombytes_negate_vartime(&local_d0,public_key);
    if (iVar1 == 0) {
      hasher512::hasher512(&local_220);
      data.m_len = 0x20;
      data.m_ptr = (char *)signature;
      hasher512::update(&local_220,data);
      data_00.m_len = 0x20;
      data_00.m_ptr = (char *)public_key;
      hasher512::update(&local_220,data_00);
      data_01.m_len = message_len;
      data_01.m_ptr = (char *)message;
      hasher512::update(&local_220,data_01);
      hasher512::final(&local_260,&local_220);
      sc_reduce((uchar *)&local_260);
      ge_double_scalarmult_vartime(&local_148,(uchar *)&local_260,&local_d0,signature + 0x20);
      ge_tobytes(&local_288,&local_148);
      auVar3[0] = -(signature[0x10] == local_278);
      auVar3[1] = -(signature[0x11] == uStack_277);
      auVar3[2] = -(signature[0x12] == uStack_276);
      auVar3[3] = -(signature[0x13] == uStack_275);
      auVar3[4] = -(signature[0x14] == uStack_274);
      auVar3[5] = -(signature[0x15] == uStack_273);
      auVar3[6] = -(signature[0x16] == uStack_272);
      auVar3[7] = -(signature[0x17] == uStack_271);
      auVar3[8] = -(signature[0x18] == uStack_270);
      auVar3[9] = -(signature[0x19] == uStack_26f);
      auVar3[10] = -(signature[0x1a] == uStack_26e);
      auVar3[0xb] = -(signature[0x1b] == uStack_26d);
      auVar3[0xc] = -(signature[0x1c] == uStack_26c);
      auVar3[0xd] = -(signature[0x1d] == uStack_26b);
      auVar3[0xe] = -(signature[0x1e] == uStack_26a);
      auVar3[0xf] = -(signature[0x1f] == uStack_269);
      auVar4[0] = -(*signature == local_288);
      auVar4[1] = -(signature[1] == uStack_287);
      auVar4[2] = -(signature[2] == uStack_286);
      auVar4[3] = -(signature[3] == uStack_285);
      auVar4[4] = -(signature[4] == uStack_284);
      auVar4[5] = -(signature[5] == uStack_283);
      auVar4[6] = -(signature[6] == uStack_282);
      auVar4[7] = -(signature[7] == uStack_281);
      auVar4[8] = -(signature[8] == uStack_280);
      auVar4[9] = -(signature[9] == uStack_27f);
      auVar4[10] = -(signature[10] == uStack_27e);
      auVar4[0xb] = -(signature[0xb] == uStack_27d);
      auVar4[0xc] = -(signature[0xc] == uStack_27c);
      auVar4[0xd] = -(signature[0xd] == uStack_27b);
      auVar4[0xe] = -(signature[0xe] == uStack_27a);
      auVar4[0xf] = -(signature[0xf] == uStack_279);
      auVar4 = auVar4 & auVar3;
      uVar2 = (uint)((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff);
      hasher512::~hasher512(&local_220);
    }
  }
  return uVar2;
}

Assistant:

int ed25519_verify(const unsigned char *signature, const unsigned char *message, std::ptrdiff_t message_len, const unsigned char *public_key) {
    unsigned char checker[32];
    ge_p3 A;
    ge_p2 R;

    if (signature[63] & 224) {
        return 0;
    }

    if (ge_frombytes_negate_vartime(&A, public_key) != 0) {
        return 0;
    }

    hasher512 hash;
    hash.update({reinterpret_cast<char const*>(signature), 32});
    hash.update({reinterpret_cast<char const*>(public_key), 32});
    hash.update({reinterpret_cast<char const*>(message), message_len});
    sha512_hash h = hash.final();
    
    sc_reduce(reinterpret_cast<unsigned char*>(h.data()));
    ge_double_scalarmult_vartime(&R, reinterpret_cast<unsigned char*>(h.data())
        , &A, signature + 32);
    ge_tobytes(checker, &R);

    if (!consttime_equal(checker, signature)) {
        return 0;
    }

    return 1;
}